

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildReg4
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot dstRegSlot,RegSlot src1RegSlot,
          RegSlot src2RegSlot,RegSlot src3RegSlot)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  RegOpnd *pRVar6;
  RegOpnd *pRVar7;
  RegOpnd *pRVar8;
  RegOpnd *pRVar9;
  Instr *pIVar10;
  Opnd *pOVar11;
  RegOpnd *src1Opnd_00;
  ByteCodeUsesInstr *this_00;
  StackSym *pSVar12;
  RegOpnd *dstOpnd_00;
  IntConstOpnd *pIVar13;
  IndirOpnd *pIVar14;
  IntConstOpnd *countIntConstOpnd;
  RegOpnd *tmpDstOpnd3;
  RegOpnd *tmpDstOpnd2;
  RegOpnd *tmpDstOpnd1;
  ByteCodeUsesInstr *byteCodeUse;
  bool src2HasByteCodeRegSlot;
  bool src1HasByteCodeRegSlot;
  RegOpnd *str3Opnd;
  RegOpnd *str2Opnd;
  RegOpnd *str1Opnd;
  RegOpnd *dstOpnd;
  Opnd *firstArg;
  RegOpnd *src0Opnd;
  RegOpnd *src3Opnd;
  RegOpnd *src2Opnd;
  RegOpnd *src1Opnd;
  Instr *instr;
  RegSlot src2RegSlot_local;
  RegSlot src1RegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  if ((newOpcode != Concat3) && (newOpcode != Restify)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x982,
                       "(newOpcode == Js::OpCode::Concat3 || newOpcode == Js::OpCode::Restify)",
                       "newOpcode == Js::OpCode::Concat3 || newOpcode == Js::OpCode::Restify");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = BuildSrcOpnd(this,src1RegSlot,TyVar);
  pRVar6 = BuildSrcOpnd(this,src2RegSlot,TyVar);
  pRVar7 = BuildSrcOpnd(this,src3RegSlot,TyVar);
  if (newOpcode == Restify) {
    pRVar8 = BuildSrcOpnd(this,dstRegSlot,TyVar);
    pRVar9 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar10 = IR::Instr::New(ExtendArg_A,&pRVar9->super_Opnd,&pRVar7->super_Opnd,this->m_func);
    AddInstr(this,pIVar10,offset);
    pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
    pOVar11 = IR::Instr::GetDst(pIVar10);
    pIVar10 = IR::Instr::New(ExtendArg_A,&pRVar7->super_Opnd,&pRVar6->super_Opnd,pOVar11,
                             this->m_func);
    AddInstr(this,pIVar10,0xffffffff);
    pRVar6 = IR::RegOpnd::New(TyVar,this->m_func);
    pOVar11 = IR::Instr::GetDst(pIVar10);
    pIVar10 = IR::Instr::New(ExtendArg_A,&pRVar6->super_Opnd,&pRVar5->super_Opnd,pOVar11,
                             this->m_func);
    AddInstr(this,pIVar10,0xffffffff);
    pRVar5 = IR::RegOpnd::New(TyVar,this->m_func);
    pOVar11 = IR::Instr::GetDst(pIVar10);
    pIVar10 = IR::Instr::New(ExtendArg_A,&pRVar5->super_Opnd,&pRVar8->super_Opnd,pOVar11,
                             this->m_func);
    AddInstr(this,pIVar10,0xffffffff);
    pOVar11 = IR::Instr::GetDst(pIVar10);
    pIVar10 = IR::Instr::New(Restify,this->m_func);
    IR::Instr::SetSrc1(pIVar10,pOVar11);
    AddInstr(this,pIVar10,0xffffffff);
  }
  else {
    pRVar8 = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
    pRVar9 = InsertConvPrimStr(this,pRVar5,offset,true);
    src1Opnd_00 = InsertConvPrimStr(this,pRVar6,0xffffffff,true);
    pRVar7 = InsertConvPrimStr(this,pRVar7,0xffffffff,true);
    bVar2 = StackSym::HasByteCodeRegSlot(pRVar5->m_sym);
    bVar3 = StackSym::HasByteCodeRegSlot(pRVar6->m_sym);
    if ((bVar2) || (bVar3)) {
      this_00 = IR::ByteCodeUsesInstr::New(this->m_func,0xffffffff);
      if (bVar2) {
        IR::ByteCodeUsesInstr::Set(this_00,&pRVar5->super_Opnd);
      }
      if (bVar3) {
        IR::ByteCodeUsesInstr::Set(this_00,&pRVar6->super_Opnd);
      }
      AddInstr(this,&this_00->super_Instr,0xffffffff);
    }
    sourceContextId = Func::GetSourceContextId(this->m_func);
    functionId = Func::GetLocalFunctionId(this->m_func);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,BackendConcatExprOptPhase,sourceContextId,functionId)
    ;
    if (bVar2) {
      pIVar13 = IR::IntConstOpnd::New(3,TyUint32,this->m_func,true);
      pIVar10 = IR::Instr::New(NewConcatStrMulti,&pRVar8->super_Opnd,&pIVar13->super_Opnd,
                               this->m_func);
      IR::Opnd::SetValueType(&pRVar8->super_Opnd,ValueType::String);
      AddInstr(this,pIVar10,0xffffffff);
      pIVar14 = IR::IndirOpnd::New(pRVar8,0,TyVar,this->m_func,false);
      pIVar10 = IR::Instr::New(SetConcatStrMultiItem,&pIVar14->super_Opnd,&pRVar9->super_Opnd,
                               this->m_func);
      AddInstr(this,pIVar10,0xffffffff);
      pIVar14 = IR::IndirOpnd::New(pRVar8,1,TyVar,this->m_func,false);
      pIVar10 = IR::Instr::New(SetConcatStrMultiItem,&pIVar14->super_Opnd,&src1Opnd_00->super_Opnd,
                               this->m_func);
      AddInstr(this,pIVar10,0xffffffff);
      pIVar14 = IR::IndirOpnd::New(pRVar8,2,TyVar,this->m_func,false);
      pIVar10 = IR::Instr::New(SetConcatStrMultiItem,&pIVar14->super_Opnd,&pRVar7->super_Opnd,
                               this->m_func);
      AddInstr(this,pIVar10,0xffffffff);
    }
    else {
      pSVar12 = StackSym::New(this->m_func);
      pRVar5 = IR::RegOpnd::New(pSVar12,TyVar,this->m_func);
      pSVar12 = StackSym::New(this->m_func);
      pRVar6 = IR::RegOpnd::New(pSVar12,TyVar,this->m_func);
      pSVar12 = StackSym::New(this->m_func);
      dstOpnd_00 = IR::RegOpnd::New(pSVar12,TyVar,this->m_func);
      pIVar10 = IR::Instr::New(SetConcatStrMultiItemBE,&pRVar5->super_Opnd,&pRVar9->super_Opnd,
                               this->m_func);
      AddInstr(this,pIVar10,0xffffffff);
      pIVar10 = IR::Instr::New(SetConcatStrMultiItemBE,&pRVar6->super_Opnd,&src1Opnd_00->super_Opnd,
                               &pRVar5->super_Opnd,this->m_func);
      AddInstr(this,pIVar10,0xffffffff);
      pIVar10 = IR::Instr::New(SetConcatStrMultiItemBE,&dstOpnd_00->super_Opnd,&pRVar7->super_Opnd,
                               &pRVar6->super_Opnd,this->m_func);
      AddInstr(this,pIVar10,0xffffffff);
      pIVar13 = IR::IntConstOpnd::New(3,TyUint32,this->m_func,true);
      pIVar10 = IR::Instr::New(NewConcatStrMultiBE,&pRVar8->super_Opnd,&pIVar13->super_Opnd,
                               &dstOpnd_00->super_Opnd,this->m_func);
      IR::Opnd::SetValueType(&pRVar8->super_Opnd,ValueType::String);
      AddInstr(this,pIVar10,0xffffffff);
    }
  }
  return;
}

Assistant:

void
IRBuilder::BuildReg4(Js::OpCode newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot,
                    Js::RegSlot src2RegSlot, Js::RegSlot src3RegSlot)
{
    IR::Instr *     instr = nullptr;
    Assert(newOpcode == Js::OpCode::Concat3 || newOpcode == Js::OpCode::Restify);

    IR::RegOpnd * src1Opnd = this->BuildSrcOpnd(src1RegSlot);
    IR::RegOpnd * src2Opnd = this->BuildSrcOpnd(src2RegSlot);
    IR::RegOpnd * src3Opnd = this->BuildSrcOpnd(src3RegSlot);    

    if (newOpcode == Js::OpCode::Restify)
    {
        IR::RegOpnd * src0Opnd = this->BuildSrcOpnd(dstRegSlot);
        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src3Opnd, m_func);
        this->AddInstr(instr, offset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src2Opnd, instr->GetDst(), m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src1Opnd, instr->GetDst(), m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src0Opnd, instr->GetDst(), m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

        IR::Opnd *firstArg = instr->GetDst();
        instr = IR::Instr::New(newOpcode, m_func);
        instr->SetSrc1(firstArg);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        return;
    }

    IR::RegOpnd * dstOpnd = this->BuildDstOpnd(dstRegSlot);

    IR::RegOpnd * str1Opnd = InsertConvPrimStr(src1Opnd, offset, true);
    IR::RegOpnd * str2Opnd = InsertConvPrimStr(src2Opnd, Js::Constants::NoByteCodeOffset, true);
    IR::RegOpnd * str3Opnd = InsertConvPrimStr(src3Opnd, Js::Constants::NoByteCodeOffset, true);

    // Need to insert a byte code use for src1/src2 that if ConvPrimStr of the src2/src3 bail out
    // we will restore it.
    bool src1HasByteCodeRegSlot = src1Opnd->m_sym->HasByteCodeRegSlot();
    bool src2HasByteCodeRegSlot = src2Opnd->m_sym->HasByteCodeRegSlot();
    if (src1HasByteCodeRegSlot || src2HasByteCodeRegSlot)
    {
        IR::ByteCodeUsesInstr * byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, Js::Constants::NoByteCodeOffset);
        if (src1HasByteCodeRegSlot)
        {
            byteCodeUse->Set(src1Opnd);
        }
        if (src2HasByteCodeRegSlot)
        {
            byteCodeUse->Set(src2Opnd);
        }
        this->AddInstr(byteCodeUse, Js::Constants::NoByteCodeOffset);
    }

    if (!PHASE_OFF(Js::BackendConcatExprOptPhase, this->m_func))
    {
        IR::RegOpnd* tmpDstOpnd1 = IR::RegOpnd::New(StackSym::New(this->m_func), TyVar, this->m_func);
        IR::RegOpnd* tmpDstOpnd2 = IR::RegOpnd::New(StackSym::New(this->m_func), TyVar, this->m_func);
        IR::RegOpnd* tmpDstOpnd3 = IR::RegOpnd::New(StackSym::New(this->m_func), TyVar, this->m_func);

        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItemBE, tmpDstOpnd1, str1Opnd, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItemBE, tmpDstOpnd2, str2Opnd, tmpDstOpnd1, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItemBE, tmpDstOpnd3, str3Opnd, tmpDstOpnd2, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

        IR::IntConstOpnd * countIntConstOpnd = IR::IntConstOpnd::New(3, TyUint32, m_func, true);
        instr = IR::Instr::New(Js::OpCode::NewConcatStrMultiBE, dstOpnd, countIntConstOpnd, tmpDstOpnd3, m_func);
        dstOpnd->SetValueType(ValueType::String);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
    }
    else
    {
        instr = IR::Instr::New(Js::OpCode::NewConcatStrMulti, dstOpnd, IR::IntConstOpnd::New(3, TyUint32, m_func, true), m_func);
        dstOpnd->SetValueType(ValueType::String);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItem, IR::IndirOpnd::New(dstOpnd, 0, TyVar, m_func), str1Opnd, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItem, IR::IndirOpnd::New(dstOpnd, 1, TyVar, m_func), str2Opnd, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItem, IR::IndirOpnd::New(dstOpnd, 2, TyVar, m_func), str3Opnd, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
    }
}